

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float.c
# Opt level: O0

void sysbvm_float_registerPrimitives(void)

{
  sysbvm_primitiveTable_registerFunction
            (sysbvm_float32_primitive_parseString,"Float32::parseString");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_float32_primitive_printString,"Float32::printString");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_float32_primitive_fromFloat64,"Float32::fromFloat64");
  sysbvm_primitiveTable_registerFunction(sysbvm_float32_primitive_add,"Float32::+");
  sysbvm_primitiveTable_registerFunction(sysbvm_float32_primitive_subtract,"Float32::-");
  sysbvm_primitiveTable_registerFunction(sysbvm_float32_primitive_negated,"Float32::negated");
  sysbvm_primitiveTable_registerFunction(sysbvm_float32_primitive_sqrt,"Float32::sqrt");
  sysbvm_primitiveTable_registerFunction(sysbvm_float32_primitive_multiply,"Float32::*");
  sysbvm_primitiveTable_registerFunction(sysbvm_float32_primitive_divide,"Float32::/");
  sysbvm_primitiveTable_registerFunction(sysbvm_float32_primitive_ceiling,"Float32::ceiling");
  sysbvm_primitiveTable_registerFunction(sysbvm_float32_primitive_floor,"Float32::floor");
  sysbvm_primitiveTable_registerFunction(sysbvm_float32_primitive_rounded,"Float32::rounded");
  sysbvm_primitiveTable_registerFunction(sysbvm_float32_primitive_truncated,"Float32::truncated");
  sysbvm_primitiveTable_registerFunction(sysbvm_float32_primitive_compare,"Float32::<=>");
  sysbvm_primitiveTable_registerFunction(sysbvm_float32_primitive_equals,"Float32::=");
  sysbvm_primitiveTable_registerFunction(sysbvm_float32_primitive_notEquals,"Float32::~=");
  sysbvm_primitiveTable_registerFunction(sysbvm_float32_primitive_lessThan,"Float32::<");
  sysbvm_primitiveTable_registerFunction(sysbvm_float32_primitive_lessEquals,"Float32::<=");
  sysbvm_primitiveTable_registerFunction(sysbvm_float32_primitive_greaterThan,"Float32::>");
  sysbvm_primitiveTable_registerFunction(sysbvm_float32_primitive_greaterEquals,"Float32::>=");
  sysbvm_primitiveTable_registerFunction(sysbvm_float32_primitive_asUInt8,"Float32::asUInt8");
  sysbvm_primitiveTable_registerFunction(sysbvm_float32_primitive_asInt8,"Float32::asInt8");
  sysbvm_primitiveTable_registerFunction(sysbvm_float32_primitive_asChar8,"Float32::asChar8");
  sysbvm_primitiveTable_registerFunction(sysbvm_float32_primitive_asUInt16,"Float32::asUInt16");
  sysbvm_primitiveTable_registerFunction(sysbvm_float32_primitive_asInt16,"Float32::asInt16");
  sysbvm_primitiveTable_registerFunction(sysbvm_float32_primitive_asChar16,"Float32::asChar16");
  sysbvm_primitiveTable_registerFunction(sysbvm_float32_primitive_asUInt32,"Float32::asUInt32");
  sysbvm_primitiveTable_registerFunction(sysbvm_float32_primitive_asInt32,"Float32::asInt32");
  sysbvm_primitiveTable_registerFunction(sysbvm_float32_primitive_asChar32,"Float32::asChar32");
  sysbvm_primitiveTable_registerFunction(sysbvm_float32_primitive_asUInt64,"Float32::asUInt64");
  sysbvm_primitiveTable_registerFunction(sysbvm_float32_primitive_asInt64,"Float32::asInt64");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_float32_primitive_asRoundedUInt8,"Float32::asRoundedUInt8");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_float32_primitive_asRoundedInt8,"Float32::asRoundedInt8");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_float32_primitive_asRoundedChar8,"Float32::asRoundedChar8");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_float32_primitive_asRoundedUInt16,"Float32::asRoundedUInt16");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_float32_primitive_asRoundedInt16,"Float32::asRoundedInt16");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_float32_primitive_asRoundedChar16,"Float32::asRoundedChar16");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_float32_primitive_asRoundedUInt32,"Float32::asRoundedUInt32");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_float32_primitive_asRoundedInt32,"Float32::asRoundedInt32");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_float32_primitive_asRoundedChar32,"Float32::asRoundedChar32");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_float32_primitive_asRoundedUInt64,"Float32::asRoundedUInt64");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_float32_primitive_asRoundedInt64,"Float32::asRoundedInt64");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_float32_primitive_asIEEEFloat32Encoding,"Float32::asIEEEFloat32Encoding");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_float32_primitive_asIEEEFloat32Decoded,"UInt32::asIEEEFloat32Decoded");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_float64_primitive_parseString,"Float64::parseString");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_float64_primitive_printString,"Float64::printString");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_float64_primitive_fromFloat32,"Float64::fromFloat32");
  sysbvm_primitiveTable_registerFunction(sysbvm_float64_primitive_add,"Float64::+");
  sysbvm_primitiveTable_registerFunction(sysbvm_float64_primitive_subtract,"Float64::-");
  sysbvm_primitiveTable_registerFunction(sysbvm_float64_primitive_negated,"Float64::negated");
  sysbvm_primitiveTable_registerFunction(sysbvm_float64_primitive_sqrt,"Float64::sqrt");
  sysbvm_primitiveTable_registerFunction(sysbvm_float64_primitive_multiply,"Float64::*");
  sysbvm_primitiveTable_registerFunction(sysbvm_float64_primitive_divide,"Float64::/");
  sysbvm_primitiveTable_registerFunction(sysbvm_float64_primitive_ceiling,"Float64::ceiling");
  sysbvm_primitiveTable_registerFunction(sysbvm_float64_primitive_floor,"Float64::floor");
  sysbvm_primitiveTable_registerFunction(sysbvm_float64_primitive_rounded,"Float64::rounded");
  sysbvm_primitiveTable_registerFunction(sysbvm_float64_primitive_truncated,"Float64::truncated");
  sysbvm_primitiveTable_registerFunction(sysbvm_float64_primitive_compare,"Float64::<=>");
  sysbvm_primitiveTable_registerFunction(sysbvm_float64_primitive_equals,"Float64::=");
  sysbvm_primitiveTable_registerFunction(sysbvm_float64_primitive_notEquals,"Float64::~=");
  sysbvm_primitiveTable_registerFunction(sysbvm_float64_primitive_lessThan,"Float64::<");
  sysbvm_primitiveTable_registerFunction(sysbvm_float64_primitive_lessEquals,"Float64::<=");
  sysbvm_primitiveTable_registerFunction(sysbvm_float64_primitive_greaterThan,"Float64::>");
  sysbvm_primitiveTable_registerFunction(sysbvm_float64_primitive_greaterEquals,"Float64::>=");
  sysbvm_primitiveTable_registerFunction(sysbvm_float64_primitive_asUInt8,"Float64::asUInt8");
  sysbvm_primitiveTable_registerFunction(sysbvm_float64_primitive_asInt8,"Float64::asInt8");
  sysbvm_primitiveTable_registerFunction(sysbvm_float64_primitive_asChar8,"Float64::asChar8");
  sysbvm_primitiveTable_registerFunction(sysbvm_float64_primitive_asUInt16,"Float64::asUInt16");
  sysbvm_primitiveTable_registerFunction(sysbvm_float64_primitive_asInt16,"Float64::asInt16");
  sysbvm_primitiveTable_registerFunction(sysbvm_float64_primitive_asChar16,"Float64::asChar16");
  sysbvm_primitiveTable_registerFunction(sysbvm_float64_primitive_asUInt32,"Float64::asUInt32");
  sysbvm_primitiveTable_registerFunction(sysbvm_float64_primitive_asInt32,"Float64::asInt32");
  sysbvm_primitiveTable_registerFunction(sysbvm_float64_primitive_asChar32,"Float64::asChar32");
  sysbvm_primitiveTable_registerFunction(sysbvm_float64_primitive_asUInt64,"Float64::asUInt64");
  sysbvm_primitiveTable_registerFunction(sysbvm_float64_primitive_asInt64,"Float64::asInt64");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_float64_primitive_asRoundedUInt8,"Float64::asRoundedUInt8");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_float64_primitive_asRoundedInt8,"Float64::asRoundedInt8");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_float64_primitive_asRoundedChar8,"Float64::asRoundedChar8");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_float64_primitive_asRoundedUInt16,"Float64::asRoundedUInt16");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_float64_primitive_asRoundedInt16,"Float64::asRoundedInt16");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_float64_primitive_asRoundedChar16,"Float64::asRoundedChar16");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_float64_primitive_asRoundedUInt32,"Float64::asRoundedUInt32");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_float64_primitive_asRoundedInt32,"Float64::asRoundedInt32");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_float64_primitive_asRoundedChar32,"Float64::asRoundedChar32");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_float64_primitive_asRoundedUInt64,"Float64::asRoundedUInt64");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_float64_primitive_asRoundedInt64,"Float64::asRoundedInt64");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_float64_primitive_asIEEEFloat64Encoding,"Float64::asIEEEFloat64Encoding");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_float64_primitive_asIEEEFloat64Decoded,"UInt64::asIEEEFloat64Decoded");
  return;
}

Assistant:

void sysbvm_float_registerPrimitives(void)
{
    // Float32
    sysbvm_primitiveTable_registerFunction(sysbvm_float32_primitive_parseString, "Float32::parseString");
    sysbvm_primitiveTable_registerFunction(sysbvm_float32_primitive_printString, "Float32::printString");
    sysbvm_primitiveTable_registerFunction(sysbvm_float32_primitive_fromFloat64, "Float32::fromFloat64");

    sysbvm_primitiveTable_registerFunction(sysbvm_float32_primitive_add, "Float32::+");
    sysbvm_primitiveTable_registerFunction(sysbvm_float32_primitive_subtract, "Float32::-");
    sysbvm_primitiveTable_registerFunction(sysbvm_float32_primitive_negated, "Float32::negated");
    sysbvm_primitiveTable_registerFunction(sysbvm_float32_primitive_sqrt, "Float32::sqrt");
    sysbvm_primitiveTable_registerFunction(sysbvm_float32_primitive_multiply, "Float32::*");
    sysbvm_primitiveTable_registerFunction(sysbvm_float32_primitive_divide, "Float32::/");

    sysbvm_primitiveTable_registerFunction(sysbvm_float32_primitive_ceiling, "Float32::ceiling");
    sysbvm_primitiveTable_registerFunction(sysbvm_float32_primitive_floor, "Float32::floor");
    sysbvm_primitiveTable_registerFunction(sysbvm_float32_primitive_rounded, "Float32::rounded");
    sysbvm_primitiveTable_registerFunction(sysbvm_float32_primitive_truncated, "Float32::truncated");

    sysbvm_primitiveTable_registerFunction(sysbvm_float32_primitive_compare, "Float32::<=>");
    sysbvm_primitiveTable_registerFunction(sysbvm_float32_primitive_equals, "Float32::=");
    sysbvm_primitiveTable_registerFunction(sysbvm_float32_primitive_notEquals, "Float32::~=");
    sysbvm_primitiveTable_registerFunction(sysbvm_float32_primitive_lessThan, "Float32::<");
    sysbvm_primitiveTable_registerFunction(sysbvm_float32_primitive_lessEquals, "Float32::<=");
    sysbvm_primitiveTable_registerFunction(sysbvm_float32_primitive_greaterThan, "Float32::>");
    sysbvm_primitiveTable_registerFunction(sysbvm_float32_primitive_greaterEquals, "Float32::>=");

    sysbvm_primitiveTable_registerFunction(sysbvm_float32_primitive_asUInt8,  "Float32::asUInt8");
    sysbvm_primitiveTable_registerFunction(sysbvm_float32_primitive_asInt8,   "Float32::asInt8");
    sysbvm_primitiveTable_registerFunction(sysbvm_float32_primitive_asChar8,  "Float32::asChar8");
    sysbvm_primitiveTable_registerFunction(sysbvm_float32_primitive_asUInt16, "Float32::asUInt16");
    sysbvm_primitiveTable_registerFunction(sysbvm_float32_primitive_asInt16,  "Float32::asInt16");
    sysbvm_primitiveTable_registerFunction(sysbvm_float32_primitive_asChar16, "Float32::asChar16");
    sysbvm_primitiveTable_registerFunction(sysbvm_float32_primitive_asUInt32, "Float32::asUInt32");
    sysbvm_primitiveTable_registerFunction(sysbvm_float32_primitive_asInt32,  "Float32::asInt32");
    sysbvm_primitiveTable_registerFunction(sysbvm_float32_primitive_asChar32, "Float32::asChar32");
    sysbvm_primitiveTable_registerFunction(sysbvm_float32_primitive_asUInt64, "Float32::asUInt64");
    sysbvm_primitiveTable_registerFunction(sysbvm_float32_primitive_asInt64,  "Float32::asInt64");

    sysbvm_primitiveTable_registerFunction(sysbvm_float32_primitive_asRoundedUInt8,  "Float32::asRoundedUInt8");
    sysbvm_primitiveTable_registerFunction(sysbvm_float32_primitive_asRoundedInt8,   "Float32::asRoundedInt8");
    sysbvm_primitiveTable_registerFunction(sysbvm_float32_primitive_asRoundedChar8,  "Float32::asRoundedChar8");
    sysbvm_primitiveTable_registerFunction(sysbvm_float32_primitive_asRoundedUInt16, "Float32::asRoundedUInt16");
    sysbvm_primitiveTable_registerFunction(sysbvm_float32_primitive_asRoundedInt16,  "Float32::asRoundedInt16");
    sysbvm_primitiveTable_registerFunction(sysbvm_float32_primitive_asRoundedChar16, "Float32::asRoundedChar16");
    sysbvm_primitiveTable_registerFunction(sysbvm_float32_primitive_asRoundedUInt32, "Float32::asRoundedUInt32");
    sysbvm_primitiveTable_registerFunction(sysbvm_float32_primitive_asRoundedInt32,  "Float32::asRoundedInt32");
    sysbvm_primitiveTable_registerFunction(sysbvm_float32_primitive_asRoundedChar32, "Float32::asRoundedChar32");
    sysbvm_primitiveTable_registerFunction(sysbvm_float32_primitive_asRoundedUInt64, "Float32::asRoundedUInt64");
    sysbvm_primitiveTable_registerFunction(sysbvm_float32_primitive_asRoundedInt64,  "Float32::asRoundedInt64");

    sysbvm_primitiveTable_registerFunction(sysbvm_float32_primitive_asIEEEFloat32Encoding, "Float32::asIEEEFloat32Encoding");
    sysbvm_primitiveTable_registerFunction(sysbvm_float32_primitive_asIEEEFloat32Decoded, "UInt32::asIEEEFloat32Decoded");

    // Float64
    sysbvm_primitiveTable_registerFunction(sysbvm_float64_primitive_parseString, "Float64::parseString");
    sysbvm_primitiveTable_registerFunction(sysbvm_float64_primitive_printString, "Float64::printString");
    sysbvm_primitiveTable_registerFunction(sysbvm_float64_primitive_fromFloat32, "Float64::fromFloat32");

    sysbvm_primitiveTable_registerFunction(sysbvm_float64_primitive_add, "Float64::+");
    sysbvm_primitiveTable_registerFunction(sysbvm_float64_primitive_subtract, "Float64::-");
    sysbvm_primitiveTable_registerFunction(sysbvm_float64_primitive_negated, "Float64::negated");
    sysbvm_primitiveTable_registerFunction(sysbvm_float64_primitive_sqrt, "Float64::sqrt");
    sysbvm_primitiveTable_registerFunction(sysbvm_float64_primitive_multiply, "Float64::*");
    sysbvm_primitiveTable_registerFunction(sysbvm_float64_primitive_divide, "Float64::/");

    sysbvm_primitiveTable_registerFunction(sysbvm_float64_primitive_ceiling, "Float64::ceiling");
    sysbvm_primitiveTable_registerFunction(sysbvm_float64_primitive_floor, "Float64::floor");
    sysbvm_primitiveTable_registerFunction(sysbvm_float64_primitive_rounded, "Float64::rounded");
    sysbvm_primitiveTable_registerFunction(sysbvm_float64_primitive_truncated, "Float64::truncated");

    sysbvm_primitiveTable_registerFunction(sysbvm_float64_primitive_compare, "Float64::<=>");
    sysbvm_primitiveTable_registerFunction(sysbvm_float64_primitive_equals, "Float64::=");
    sysbvm_primitiveTable_registerFunction(sysbvm_float64_primitive_notEquals, "Float64::~=");
    sysbvm_primitiveTable_registerFunction(sysbvm_float64_primitive_lessThan, "Float64::<");
    sysbvm_primitiveTable_registerFunction(sysbvm_float64_primitive_lessEquals, "Float64::<=");
    sysbvm_primitiveTable_registerFunction(sysbvm_float64_primitive_greaterThan, "Float64::>");
    sysbvm_primitiveTable_registerFunction(sysbvm_float64_primitive_greaterEquals, "Float64::>=");

    sysbvm_primitiveTable_registerFunction(sysbvm_float64_primitive_asUInt8,  "Float64::asUInt8");
    sysbvm_primitiveTable_registerFunction(sysbvm_float64_primitive_asInt8,   "Float64::asInt8");
    sysbvm_primitiveTable_registerFunction(sysbvm_float64_primitive_asChar8,  "Float64::asChar8");
    sysbvm_primitiveTable_registerFunction(sysbvm_float64_primitive_asUInt16, "Float64::asUInt16");
    sysbvm_primitiveTable_registerFunction(sysbvm_float64_primitive_asInt16,  "Float64::asInt16");
    sysbvm_primitiveTable_registerFunction(sysbvm_float64_primitive_asChar16, "Float64::asChar16");
    sysbvm_primitiveTable_registerFunction(sysbvm_float64_primitive_asUInt32, "Float64::asUInt32");
    sysbvm_primitiveTable_registerFunction(sysbvm_float64_primitive_asInt32,  "Float64::asInt32");
    sysbvm_primitiveTable_registerFunction(sysbvm_float64_primitive_asChar32, "Float64::asChar32");
    sysbvm_primitiveTable_registerFunction(sysbvm_float64_primitive_asUInt64, "Float64::asUInt64");
    sysbvm_primitiveTable_registerFunction(sysbvm_float64_primitive_asInt64,  "Float64::asInt64");

    sysbvm_primitiveTable_registerFunction(sysbvm_float64_primitive_asRoundedUInt8,  "Float64::asRoundedUInt8");
    sysbvm_primitiveTable_registerFunction(sysbvm_float64_primitive_asRoundedInt8,   "Float64::asRoundedInt8");
    sysbvm_primitiveTable_registerFunction(sysbvm_float64_primitive_asRoundedChar8,  "Float64::asRoundedChar8");
    sysbvm_primitiveTable_registerFunction(sysbvm_float64_primitive_asRoundedUInt16, "Float64::asRoundedUInt16");
    sysbvm_primitiveTable_registerFunction(sysbvm_float64_primitive_asRoundedInt16,  "Float64::asRoundedInt16");
    sysbvm_primitiveTable_registerFunction(sysbvm_float64_primitive_asRoundedChar16, "Float64::asRoundedChar16");
    sysbvm_primitiveTable_registerFunction(sysbvm_float64_primitive_asRoundedUInt32, "Float64::asRoundedUInt32");
    sysbvm_primitiveTable_registerFunction(sysbvm_float64_primitive_asRoundedInt32,  "Float64::asRoundedInt32");
    sysbvm_primitiveTable_registerFunction(sysbvm_float64_primitive_asRoundedChar32, "Float64::asRoundedChar32");
    sysbvm_primitiveTable_registerFunction(sysbvm_float64_primitive_asRoundedUInt64, "Float64::asRoundedUInt64");
    sysbvm_primitiveTable_registerFunction(sysbvm_float64_primitive_asRoundedInt64,  "Float64::asRoundedInt64");

    sysbvm_primitiveTable_registerFunction(sysbvm_float64_primitive_asIEEEFloat64Encoding, "Float64::asIEEEFloat64Encoding");
    sysbvm_primitiveTable_registerFunction(sysbvm_float64_primitive_asIEEEFloat64Decoded, "UInt64::asIEEEFloat64Decoded");
}